

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRErrorCorrectionLevel.cpp
# Opt level: O2

ErrorCorrectionLevel ZXing::QRCode::ECLevelFromString(char *str)

{
  if ((byte)(*str + 0xb8U) < 10) {
    return *(ErrorCorrectionLevel *)(&DAT_001a7154 + (ulong)(byte)(*str + 0xb8U) * 4);
  }
  return Invalid;
}

Assistant:

ErrorCorrectionLevel ECLevelFromString(const char* str)
{
	switch (str[0]) {
	case 'L': return ErrorCorrectionLevel::Low;
	case 'M': return ErrorCorrectionLevel::Medium;
	case 'Q': return ErrorCorrectionLevel::Quality;
	case 'H': return ErrorCorrectionLevel::High;
	default:  return ErrorCorrectionLevel::Invalid;
	}
}